

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::prelu(tensor *dest,tensor *src,tensor *param)

{
  float fVar1;
  float fVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  
  iVar6 = (*param->_vptr_tensor[2])(param);
  fVar1 = *(float *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*src->_vptr_tensor[2])(src);
  iVar7 = (*dest->_vptr_tensor[3])(dest);
  lVar3 = dest->m_size;
  if (lVar3 != 0) {
    lVar8 = 0;
    do {
      fVar2 = *(float *)(CONCAT44(extraout_var_00,iVar6) + lVar8 * 4);
      uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar2),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      *(uint *)(CONCAT44(extraout_var_01,iVar7) + lVar8 * 4) =
           (uint)bVar5 * (int)fVar2 + (uint)!bVar5 * (int)(fVar1 * fVar2);
      lVar8 = lVar8 + 1;
    } while (lVar3 != lVar8);
  }
  return;
}

Assistant:

void prelu (
            tensor& dest,
            const tensor& src,
            const tensor& param
        )
        {
            const float p = param.host()[0];
            const float* s = src.host();
            float* d = dest.host();
            for (size_t i = 0; i < dest.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = p*s[i];
            }
        }